

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_ModifyMonitoredItems
               (UA_Server *server,UA_Session *session,UA_ModifyMonitoredItemsRequest *request,
               UA_ModifyMonitoredItemsResponse *response)

{
  size_t __nmemb;
  UA_StatusCode UVar1;
  UA_MonitoredItemModifyResult *pUVar2;
  ulong uVar3;
  UA_MonitoredItem *mon;
  UA_Subscription *pUVar4;
  
  UVar1 = 0x802b0000;
  if (request->timestampsToReturn < 4) {
    pUVar4 = (UA_Subscription *)&session->serverSubscriptions;
    UVar1 = 0x80280000;
    do {
      pUVar4 = (pUVar4->listEntry).le_next;
      if (pUVar4 == (UA_Subscription *)0x0) goto LAB_0012594e;
    } while (pUVar4->subscriptionID != request->subscriptionId);
    if (pUVar4 != (UA_Subscription *)0x0) {
      pUVar4->currentLifetimeCount = 0;
      __nmemb = request->itemsToModifySize;
      if (__nmemb == 0) {
        UVar1 = 0x800f0000;
      }
      else {
        pUVar2 = (UA_MonitoredItemModifyResult *)calloc(__nmemb,0x48);
        response->results = pUVar2;
        if (pUVar2 != (UA_MonitoredItemModifyResult *)0x0) {
          response->resultsSize = __nmemb;
          if (request->itemsToModifySize == 0) {
            return;
          }
          uVar3 = 0;
          do {
            pUVar2 = response->results + uVar3;
            mon = (UA_MonitoredItem *)&pUVar4->monitoredItems;
            do {
              mon = (mon->listEntry).le_next;
              if (mon == (UA_MonitoredItem *)0x0) {
                pUVar2->statusCode = 0x80420000;
                goto LAB_00125a4c;
              }
            } while (mon->itemId != request->itemsToModify[uVar3].monitoredItemId);
            setMonitoredItemSettings
                      (server,mon,mon->monitoringMode,
                       &request->itemsToModify[uVar3].requestedParameters);
            pUVar2->revisedSamplingInterval = mon->samplingInterval;
            pUVar2->revisedQueueSize = mon->maxQueueSize;
LAB_00125a4c:
            uVar3 = uVar3 + 1;
            if (request->itemsToModifySize <= uVar3) {
              return;
            }
          } while( true );
        }
        UVar1 = 0x80030000;
      }
    }
  }
LAB_0012594e:
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_ModifyMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_ModifyMonitoredItemsRequest *request,
                                  UA_ModifyMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing ModifyMonitoredItemsRequest");

    /* check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToModifySize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToModifySize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMMODIFYRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToModifySize;

    for(size_t i = 0; i < request->itemsToModifySize; ++i)
        Service_ModifyMonitoredItems_single(server, session, sub, &request->itemsToModify[i],
                                            &response->results[i]);

}